

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v128 __thiscall simd_test_sse4_1::c_imm_v128_shr_n_u32<1>(simd_test_sse4_1 *this,c_v128 a)

{
  undefined1 auVar1 [16];
  
  auVar1._0_8_ = (ulong)this >> 1;
  auVar1._8_8_ = a.u64[0] >> 1;
  return (c_v128)(auVar1 & _DAT_00c1e400);
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift right %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] >> n;
  t.u32[0] = a.u32[0] >> n;
  return t;
}